

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O3

char * google::protobuf::internal::UnknownFieldParse
                 (uint32 tag,InternalMetadataWithArena *metadata,char *ptr,ParseContext *ctx)

{
  void *pvVar1;
  char *pcVar2;
  UnknownFieldParserHelper field_parser;
  UnknownFieldParserHelper local_20;
  
  pvVar1 = (metadata->
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           ).ptr_;
  if (((ulong)pvVar1 & 1) == 0) {
    local_20.unknown_ =
         InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
         ::mutable_unknown_fields_slow
                   (&metadata->
                     super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                   );
  }
  else {
    local_20.unknown_ = (UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe);
  }
  pcVar2 = FieldParser<google::protobuf::internal::UnknownFieldParserHelper>
                     ((ulong)tag,&local_20,ptr,ctx);
  return pcVar2;
}

Assistant:

const char* UnknownFieldParse(uint32 tag, InternalMetadataWithArena* metadata,
                              const char* ptr, ParseContext* ctx) {
  return UnknownFieldParse(tag, metadata->mutable_unknown_fields(), ptr, ctx);
}